

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnRt4ShadedPalCommand::Execute
          (DrawColumnRt4ShadedPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  int iVar11;
  
  iVar1 = (this->super_PalRtCommand).yl;
  iVar5 = ((this->super_PalRtCommand).yh - iVar1) + 1;
  iVar11 = thread->pass_end_y - iVar1;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  if (iVar5 < iVar11) {
    iVar11 = iVar5;
  }
  uVar7 = thread->pass_start_y - iVar1;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  iVar5 = thread->num_cores;
  iVar8 = (iVar5 - (int)((iVar1 + uVar7) - thread->core) % iVar5) % iVar5;
  iVar11 = (int)((~uVar7 + iVar5 + iVar11) - iVar8) / iVar5;
  if (0 < iVar11) {
    iVar2 = (this->super_PalRtCommand)._color;
    iVar8 = iVar1 + uVar7 + iVar8;
    puVar3 = (this->super_PalRtCommand)._colormap;
    iVar6 = iVar8 / iVar5 << 2;
    puVar4 = thread->dc_temp;
    iVar1 = (this->super_PalRtCommand)._pitch;
    pbVar9 = (this->super_PalRtCommand)._destorg +
             (long)((this->super_PalRtCommand).sx + (&ylookup)[iVar8]) + 3;
    lVar10 = 0;
    do {
      uVar7 = Col2RGB8[puVar3[puVar4[lVar10 * 4 + (long)iVar6]]][iVar2] +
              Col2RGB8[0x40 - puVar3[puVar4[lVar10 * 4 + (long)iVar6]]][pbVar9[-3]] | 0x1f07c1f;
      pbVar9[-3] = RGB32k.All[uVar7 >> 0xf & uVar7];
      uVar7 = Col2RGB8[puVar3[puVar4[lVar10 * 4 + (long)iVar6 + 1]]][iVar2] +
              Col2RGB8[0x40 - puVar3[puVar4[lVar10 * 4 + (long)iVar6 + 1]]][pbVar9[-2]] | 0x1f07c1f;
      pbVar9[-2] = RGB32k.All[uVar7 >> 0xf & uVar7];
      uVar7 = Col2RGB8[puVar3[puVar4[lVar10 * 4 + (long)iVar6 + 2]]][iVar2] +
              Col2RGB8[0x40 - puVar3[puVar4[lVar10 * 4 + (long)iVar6 + 2]]][pbVar9[-1]] | 0x1f07c1f;
      pbVar9[-1] = RGB32k.All[uVar7 >> 0xf & uVar7];
      uVar7 = Col2RGB8[puVar3[puVar4[lVar10 * 4 + (long)iVar6 + 3]]][iVar2] +
              Col2RGB8[0x40 - puVar3[puVar4[lVar10 * 4 + (long)iVar6 + 3]]][*pbVar9] | 0x1f07c1f;
      *pbVar9 = RGB32k.All[uVar7 >> 0xf & uVar7];
      pbVar9 = pbVar9 + iVar5 * iVar1;
      lVar10 = lVar10 + 1;
    } while (iVar11 != (int)lVar10);
  }
  return;
}

Assistant:

void DrawColumnRt4ShadedPalCommand::Execute(DrawerThread *thread)
	{
		uint32_t *fgstart;
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		fgstart = &Col2RGB8[0][_color];
		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;

		do {
			uint32_t val;
		
			val = colormap[source[0]];
			val = (Col2RGB8[64-val][dest[0]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[0] = RGB32k.All[val & (val>>15)];

			val = colormap[source[1]];
			val = (Col2RGB8[64-val][dest[1]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[1] = RGB32k.All[val & (val>>15)];

			val = colormap[source[2]];
			val = (Col2RGB8[64-val][dest[2]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[2] = RGB32k.All[val & (val>>15)];

			val = colormap[source[3]];
			val = (Col2RGB8[64-val][dest[3]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[3] = RGB32k.All[val & (val>>15)];

			source += 4;
			dest += pitch;
		} while (--count);
	}